

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GeneralMatrixVector.h
# Opt level: O2

void Eigen::internal::
     general_matrix_vector_product<long,_float,_Eigen::internal::const_blas_data_mapper<float,_long,_0>,_0,_false,_float,_Eigen::internal::const_blas_data_mapper<float,_long,_0>,_false,_0>
     ::run(long rows,long cols,const_blas_data_mapper<float,_long,_0> *alhs,
          const_blas_data_mapper<float,_long,_0> *rhs,ResScalar *res,long resIncr,float alpha)

{
  ResScalar *pRVar1;
  float *pfVar2;
  float fVar3;
  float *pfVar4;
  long lVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  long lVar20;
  float *pfVar21;
  float *pfVar22;
  long lVar23;
  long j_1;
  float *pfVar24;
  long lVar25;
  long lVar26;
  float *pfVar27;
  float *pfVar28;
  ulong uVar29;
  long j;
  long lVar30;
  long lVar31;
  long lVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  float fVar44;
  float fVar45;
  float fVar46;
  float fVar47;
  float fVar48;
  float fVar49;
  float fVar50;
  float fVar51;
  float fVar52;
  float fVar53;
  float fVar54;
  float fVar55;
  float fVar56;
  float fVar57;
  float fVar58;
  float fVar59;
  float fVar60;
  float fVar61;
  float fVar62;
  float fVar63;
  float fVar64;
  float *local_a8;
  float *local_a0;
  long local_98;
  
  pfVar4 = (alhs->super_blas_data_mapper<const_float,_long,_0,_0,_1>).m_data;
  lVar5 = (alhs->super_blas_data_mapper<const_float,_long,_0,_0,_1>).m_stride;
  lVar25 = 0x10;
  local_98 = 4;
  if (31999 < (ulong)(lVar5 * 4)) {
    lVar25 = 4;
  }
  if (cols < 0x80) {
    lVar25 = cols;
  }
  lVar26 = lVar25 * lVar5;
  pfVar24 = pfVar4 + 0x1c;
  pfVar27 = pfVar4 + 0xc;
  local_a0 = pfVar4 + 8;
  lVar32 = 0;
  local_a8 = pfVar4;
  while (lVar32 < cols) {
    lVar20 = lVar25 + lVar32;
    lVar23 = cols;
    if (lVar20 < cols) {
      lVar23 = lVar20;
    }
    pfVar22 = pfVar24;
    pfVar28 = pfVar27;
    for (uVar29 = 0; (long)uVar29 < rows + -0x1f; uVar29 = uVar29 + 0x20) {
      fVar33 = 0.0;
      fVar34 = 0.0;
      fVar35 = 0.0;
      fVar36 = 0.0;
      fVar37 = 0.0;
      fVar38 = 0.0;
      fVar39 = 0.0;
      fVar40 = 0.0;
      fVar41 = 0.0;
      fVar42 = 0.0;
      fVar43 = 0.0;
      fVar44 = 0.0;
      fVar45 = 0.0;
      fVar46 = 0.0;
      fVar47 = 0.0;
      fVar48 = 0.0;
      fVar49 = 0.0;
      fVar50 = 0.0;
      fVar51 = 0.0;
      fVar52 = 0.0;
      fVar53 = 0.0;
      fVar54 = 0.0;
      fVar55 = 0.0;
      fVar56 = 0.0;
      fVar57 = 0.0;
      fVar58 = 0.0;
      fVar59 = 0.0;
      fVar60 = 0.0;
      fVar61 = 0.0;
      fVar62 = 0.0;
      fVar63 = 0.0;
      fVar64 = 0.0;
      pfVar21 = pfVar22;
      for (lVar30 = lVar32; lVar30 < lVar23; lVar30 = lVar30 + 1) {
        fVar3 = (rhs->super_blas_data_mapper<const_float,_long,_0,_0,_1>).m_data[lVar30];
        fVar61 = fVar61 + pfVar21[-0x1c] * fVar3;
        fVar62 = fVar62 + pfVar21[-0x1b] * fVar3;
        fVar63 = fVar63 + pfVar21[-0x1a] * fVar3;
        fVar64 = fVar64 + pfVar21[-0x19] * fVar3;
        fVar57 = fVar57 + pfVar21[-0x18] * fVar3;
        fVar58 = fVar58 + pfVar21[-0x17] * fVar3;
        fVar59 = fVar59 + pfVar21[-0x16] * fVar3;
        fVar60 = fVar60 + pfVar21[-0x15] * fVar3;
        fVar53 = fVar53 + pfVar21[-0x14] * fVar3;
        fVar54 = fVar54 + pfVar21[-0x13] * fVar3;
        fVar55 = fVar55 + pfVar21[-0x12] * fVar3;
        fVar56 = fVar56 + pfVar21[-0x11] * fVar3;
        fVar49 = fVar49 + pfVar21[-0x10] * fVar3;
        fVar50 = fVar50 + pfVar21[-0xf] * fVar3;
        fVar51 = fVar51 + pfVar21[-0xe] * fVar3;
        fVar52 = fVar52 + pfVar21[-0xd] * fVar3;
        fVar45 = fVar45 + pfVar21[-0xc] * fVar3;
        fVar46 = fVar46 + pfVar21[-0xb] * fVar3;
        fVar47 = fVar47 + pfVar21[-10] * fVar3;
        fVar48 = fVar48 + pfVar21[-9] * fVar3;
        fVar41 = fVar41 + pfVar21[-8] * fVar3;
        fVar42 = fVar42 + pfVar21[-7] * fVar3;
        fVar43 = fVar43 + pfVar21[-6] * fVar3;
        fVar44 = fVar44 + pfVar21[-5] * fVar3;
        fVar37 = fVar37 + pfVar21[-4] * fVar3;
        fVar38 = fVar38 + pfVar21[-3] * fVar3;
        fVar39 = fVar39 + pfVar21[-2] * fVar3;
        fVar40 = fVar40 + pfVar21[-1] * fVar3;
        fVar33 = fVar33 + *pfVar21 * fVar3;
        fVar34 = fVar34 + pfVar21[1] * fVar3;
        fVar35 = fVar35 + pfVar21[2] * fVar3;
        fVar36 = fVar36 + pfVar21[3] * fVar3;
        pfVar21 = pfVar21 + lVar5;
      }
      pfVar21 = res + uVar29;
      fVar3 = pfVar21[1];
      fVar6 = pfVar21[2];
      fVar7 = pfVar21[3];
      pfVar2 = res + uVar29 + 4;
      fVar8 = *pfVar2;
      fVar9 = pfVar2[1];
      fVar10 = pfVar2[2];
      fVar11 = pfVar2[3];
      pfVar2 = res + uVar29 + 8;
      fVar12 = *pfVar2;
      fVar13 = pfVar2[1];
      fVar14 = pfVar2[2];
      fVar15 = pfVar2[3];
      pfVar2 = res + uVar29 + 0xc;
      fVar16 = *pfVar2;
      fVar17 = pfVar2[1];
      fVar18 = pfVar2[2];
      fVar19 = pfVar2[3];
      pRVar1 = res + uVar29;
      *pRVar1 = *pfVar21 + fVar61 * alpha;
      pRVar1[1] = fVar3 + fVar62 * alpha;
      pRVar1[2] = fVar6 + fVar63 * alpha;
      pRVar1[3] = fVar7 + fVar64 * alpha;
      pRVar1 = res + uVar29 + 4;
      *pRVar1 = fVar57 * alpha + fVar8;
      pRVar1[1] = fVar58 * alpha + fVar9;
      pRVar1[2] = fVar59 * alpha + fVar10;
      pRVar1[3] = fVar60 * alpha + fVar11;
      pRVar1 = res + uVar29 + 8;
      *pRVar1 = fVar53 * alpha + fVar12;
      pRVar1[1] = fVar54 * alpha + fVar13;
      pRVar1[2] = fVar55 * alpha + fVar14;
      pRVar1[3] = fVar56 * alpha + fVar15;
      pRVar1 = res + uVar29 + 0xc;
      *pRVar1 = fVar49 * alpha + fVar16;
      pRVar1[1] = fVar50 * alpha + fVar17;
      pRVar1[2] = fVar51 * alpha + fVar18;
      pRVar1[3] = fVar52 * alpha + fVar19;
      pfVar21 = res + uVar29 + 0x10;
      fVar49 = pfVar21[1];
      fVar50 = pfVar21[2];
      fVar51 = pfVar21[3];
      pRVar1 = res + uVar29 + 0x10;
      *pRVar1 = fVar45 * alpha + *pfVar21;
      pRVar1[1] = fVar46 * alpha + fVar49;
      pRVar1[2] = fVar47 * alpha + fVar50;
      pRVar1[3] = fVar48 * alpha + fVar51;
      pfVar21 = res + uVar29 + 0x14;
      fVar45 = pfVar21[1];
      fVar46 = pfVar21[2];
      fVar47 = pfVar21[3];
      pRVar1 = res + uVar29 + 0x14;
      *pRVar1 = fVar41 * alpha + *pfVar21;
      pRVar1[1] = fVar42 * alpha + fVar45;
      pRVar1[2] = fVar43 * alpha + fVar46;
      pRVar1[3] = fVar44 * alpha + fVar47;
      pfVar21 = res + uVar29 + 0x18;
      fVar41 = pfVar21[1];
      fVar42 = pfVar21[2];
      fVar43 = pfVar21[3];
      pRVar1 = res + uVar29 + 0x18;
      *pRVar1 = fVar37 * alpha + *pfVar21;
      pRVar1[1] = fVar38 * alpha + fVar41;
      pRVar1[2] = fVar39 * alpha + fVar42;
      pRVar1[3] = fVar40 * alpha + fVar43;
      pfVar21 = res + uVar29 + 0x1c;
      fVar37 = pfVar21[1];
      fVar38 = pfVar21[2];
      fVar39 = pfVar21[3];
      pRVar1 = res + uVar29 + 0x1c;
      *pRVar1 = fVar33 * alpha + *pfVar21;
      pRVar1[1] = fVar34 * alpha + fVar37;
      pRVar1[2] = fVar35 * alpha + fVar38;
      pRVar1[3] = fVar36 * alpha + fVar39;
      pfVar22 = pfVar22 + 0x20;
      pfVar28 = pfVar28 + 0x20;
    }
    if ((long)uVar29 < rows + -0xf) {
      fVar33 = 0.0;
      fVar34 = 0.0;
      fVar35 = 0.0;
      fVar36 = 0.0;
      fVar37 = 0.0;
      fVar38 = 0.0;
      fVar39 = 0.0;
      fVar40 = 0.0;
      fVar41 = 0.0;
      fVar42 = 0.0;
      fVar43 = 0.0;
      fVar44 = 0.0;
      fVar45 = 0.0;
      fVar46 = 0.0;
      fVar47 = 0.0;
      fVar48 = 0.0;
      for (lVar30 = lVar32; lVar30 < lVar23; lVar30 = lVar30 + 1) {
        fVar49 = (rhs->super_blas_data_mapper<const_float,_long,_0,_0,_1>).m_data[lVar30];
        fVar45 = fVar45 + pfVar28[-0xc] * fVar49;
        fVar46 = fVar46 + pfVar28[-0xb] * fVar49;
        fVar47 = fVar47 + pfVar28[-10] * fVar49;
        fVar48 = fVar48 + pfVar28[-9] * fVar49;
        fVar41 = fVar41 + pfVar28[-8] * fVar49;
        fVar42 = fVar42 + pfVar28[-7] * fVar49;
        fVar43 = fVar43 + pfVar28[-6] * fVar49;
        fVar44 = fVar44 + pfVar28[-5] * fVar49;
        fVar37 = fVar37 + pfVar28[-4] * fVar49;
        fVar38 = fVar38 + pfVar28[-3] * fVar49;
        fVar39 = fVar39 + pfVar28[-2] * fVar49;
        fVar40 = fVar40 + pfVar28[-1] * fVar49;
        fVar33 = fVar33 + *pfVar28 * fVar49;
        fVar34 = fVar34 + pfVar28[1] * fVar49;
        fVar35 = fVar35 + pfVar28[2] * fVar49;
        fVar36 = fVar36 + pfVar28[3] * fVar49;
        pfVar28 = pfVar28 + lVar5;
      }
      pfVar22 = res + uVar29;
      fVar49 = pfVar22[1];
      fVar50 = pfVar22[2];
      fVar51 = pfVar22[3];
      pfVar28 = res + uVar29 + 4;
      fVar52 = *pfVar28;
      fVar53 = pfVar28[1];
      fVar54 = pfVar28[2];
      fVar55 = pfVar28[3];
      pfVar28 = res + uVar29 + 8;
      fVar56 = *pfVar28;
      fVar57 = pfVar28[1];
      fVar58 = pfVar28[2];
      fVar59 = pfVar28[3];
      pfVar28 = res + uVar29 + 0xc;
      fVar60 = *pfVar28;
      fVar61 = pfVar28[1];
      fVar62 = pfVar28[2];
      fVar63 = pfVar28[3];
      pRVar1 = res + uVar29;
      *pRVar1 = *pfVar22 + fVar45 * alpha;
      pRVar1[1] = fVar49 + fVar46 * alpha;
      pRVar1[2] = fVar50 + fVar47 * alpha;
      pRVar1[3] = fVar51 + fVar48 * alpha;
      pRVar1 = res + uVar29 + 4;
      *pRVar1 = fVar41 * alpha + fVar52;
      pRVar1[1] = fVar42 * alpha + fVar53;
      pRVar1[2] = fVar43 * alpha + fVar54;
      pRVar1[3] = fVar44 * alpha + fVar55;
      pRVar1 = res + uVar29 + 8;
      *pRVar1 = fVar37 * alpha + fVar56;
      pRVar1[1] = fVar38 * alpha + fVar57;
      pRVar1[2] = fVar39 * alpha + fVar58;
      pRVar1[3] = fVar40 * alpha + fVar59;
      pRVar1 = res + uVar29 + 0xc;
      *pRVar1 = fVar33 * alpha + fVar60;
      pRVar1[1] = fVar34 * alpha + fVar61;
      pRVar1[2] = fVar35 * alpha + fVar62;
      pRVar1[3] = fVar36 * alpha + fVar63;
      uVar29 = uVar29 | 0x10;
    }
    if ((long)uVar29 < rows + -0xb) {
      pfVar22 = local_a0 + uVar29;
      fVar33 = 0.0;
      fVar34 = 0.0;
      fVar35 = 0.0;
      fVar36 = 0.0;
      fVar37 = 0.0;
      fVar38 = 0.0;
      fVar39 = 0.0;
      fVar40 = 0.0;
      fVar41 = 0.0;
      fVar42 = 0.0;
      fVar43 = 0.0;
      fVar44 = 0.0;
      for (lVar30 = lVar32; lVar30 < lVar23; lVar30 = lVar30 + 1) {
        fVar45 = (rhs->super_blas_data_mapper<const_float,_long,_0,_0,_1>).m_data[lVar30];
        fVar41 = fVar41 + pfVar22[-8] * fVar45;
        fVar42 = fVar42 + pfVar22[-7] * fVar45;
        fVar43 = fVar43 + pfVar22[-6] * fVar45;
        fVar44 = fVar44 + pfVar22[-5] * fVar45;
        fVar37 = fVar37 + pfVar22[-4] * fVar45;
        fVar38 = fVar38 + pfVar22[-3] * fVar45;
        fVar39 = fVar39 + pfVar22[-2] * fVar45;
        fVar40 = fVar40 + pfVar22[-1] * fVar45;
        fVar33 = fVar33 + *pfVar22 * fVar45;
        fVar34 = fVar34 + pfVar22[1] * fVar45;
        fVar35 = fVar35 + pfVar22[2] * fVar45;
        fVar36 = fVar36 + pfVar22[3] * fVar45;
        pfVar22 = pfVar22 + lVar5;
      }
      pfVar22 = res + uVar29;
      fVar45 = pfVar22[1];
      fVar46 = pfVar22[2];
      fVar47 = pfVar22[3];
      pfVar28 = res + uVar29 + 4;
      fVar48 = *pfVar28;
      fVar49 = pfVar28[1];
      fVar50 = pfVar28[2];
      fVar51 = pfVar28[3];
      pfVar28 = res + uVar29 + 8;
      fVar52 = *pfVar28;
      fVar53 = pfVar28[1];
      fVar54 = pfVar28[2];
      fVar55 = pfVar28[3];
      pRVar1 = res + uVar29;
      *pRVar1 = *pfVar22 + fVar41 * alpha;
      pRVar1[1] = fVar45 + fVar42 * alpha;
      pRVar1[2] = fVar46 + fVar43 * alpha;
      pRVar1[3] = fVar47 + fVar44 * alpha;
      pRVar1 = res + uVar29 + 4;
      *pRVar1 = fVar37 * alpha + fVar48;
      pRVar1[1] = fVar38 * alpha + fVar49;
      pRVar1[2] = fVar39 * alpha + fVar50;
      pRVar1[3] = fVar40 * alpha + fVar51;
      pRVar1 = res + uVar29 + 8;
      *pRVar1 = fVar33 * alpha + fVar52;
      pRVar1[1] = fVar34 * alpha + fVar53;
      pRVar1[2] = fVar35 * alpha + fVar54;
      pRVar1[3] = fVar36 * alpha + fVar55;
      uVar29 = uVar29 + 0xc;
    }
    if ((long)uVar29 < rows + -7) {
      fVar37 = 0.0;
      fVar38 = 0.0;
      fVar39 = 0.0;
      fVar40 = 0.0;
      fVar33 = 0.0;
      fVar34 = 0.0;
      fVar35 = 0.0;
      fVar36 = 0.0;
      lVar30 = local_98;
      for (lVar31 = lVar32; lVar31 < lVar23; lVar31 = lVar31 + 1) {
        fVar41 = (rhs->super_blas_data_mapper<const_float,_long,_0,_0,_1>).m_data[lVar31];
        pfVar28 = pfVar4 + uVar29 + lVar30 + -4;
        pfVar22 = pfVar4 + uVar29 + lVar30;
        fVar37 = fVar37 + *pfVar28 * fVar41;
        fVar38 = fVar38 + pfVar28[1] * fVar41;
        fVar39 = fVar39 + pfVar28[2] * fVar41;
        fVar40 = fVar40 + pfVar28[3] * fVar41;
        fVar33 = fVar33 + *pfVar22 * fVar41;
        fVar34 = fVar34 + pfVar22[1] * fVar41;
        fVar35 = fVar35 + pfVar22[2] * fVar41;
        fVar36 = fVar36 + pfVar22[3] * fVar41;
        lVar30 = lVar30 + lVar5;
      }
      pfVar22 = res + uVar29;
      fVar41 = pfVar22[1];
      fVar42 = pfVar22[2];
      fVar43 = pfVar22[3];
      pfVar28 = res + uVar29 + 4;
      fVar44 = *pfVar28;
      fVar45 = pfVar28[1];
      fVar46 = pfVar28[2];
      fVar47 = pfVar28[3];
      pRVar1 = res + uVar29;
      *pRVar1 = *pfVar22 + fVar37 * alpha;
      pRVar1[1] = fVar41 + fVar38 * alpha;
      pRVar1[2] = fVar42 + fVar39 * alpha;
      pRVar1[3] = fVar43 + fVar40 * alpha;
      pRVar1 = res + uVar29 + 4;
      *pRVar1 = fVar33 * alpha + fVar44;
      pRVar1[1] = fVar34 * alpha + fVar45;
      pRVar1[2] = fVar35 * alpha + fVar46;
      pRVar1[3] = fVar36 * alpha + fVar47;
      uVar29 = uVar29 + 8;
    }
    if ((long)uVar29 < rows + -3) {
      pfVar22 = local_a8 + uVar29;
      fVar33 = 0.0;
      fVar34 = 0.0;
      fVar35 = 0.0;
      fVar36 = 0.0;
      for (lVar30 = lVar32; lVar30 < lVar23; lVar30 = lVar30 + 1) {
        fVar37 = (rhs->super_blas_data_mapper<const_float,_long,_0,_0,_1>).m_data[lVar30];
        fVar33 = fVar33 + *pfVar22 * fVar37;
        fVar34 = fVar34 + pfVar22[1] * fVar37;
        fVar35 = fVar35 + pfVar22[2] * fVar37;
        fVar36 = fVar36 + pfVar22[3] * fVar37;
        pfVar22 = pfVar22 + lVar5;
      }
      pfVar22 = res + uVar29;
      fVar37 = pfVar22[1];
      fVar38 = pfVar22[2];
      fVar39 = pfVar22[3];
      pRVar1 = res + uVar29;
      *pRVar1 = fVar33 * alpha + *pfVar22;
      pRVar1[1] = fVar34 * alpha + fVar37;
      pRVar1[2] = fVar35 * alpha + fVar38;
      pRVar1[3] = fVar36 * alpha + fVar39;
      uVar29 = uVar29 + 4;
    }
    pfVar22 = local_a8 + uVar29;
    for (; (long)uVar29 < rows; uVar29 = uVar29 + 1) {
      fVar33 = 0.0;
      pfVar28 = pfVar22;
      for (lVar30 = lVar32; lVar30 < lVar23; lVar30 = lVar30 + 1) {
        fVar33 = fVar33 + *pfVar28 *
                          (rhs->super_blas_data_mapper<const_float,_long,_0,_0,_1>).m_data[lVar30];
        pfVar28 = pfVar28 + lVar5;
      }
      res[uVar29] = fVar33 * alpha + res[uVar29];
      pfVar22 = pfVar22 + 1;
    }
    pfVar24 = pfVar24 + lVar26;
    pfVar27 = pfVar27 + lVar26;
    local_a0 = local_a0 + lVar26;
    local_98 = local_98 + lVar26;
    local_a8 = local_a8 + lVar26;
    lVar32 = lVar20;
  }
  return;
}

Assistant:

EIGEN_DEVICE_FUNC EIGEN_DONT_INLINE void general_matrix_vector_product<Index,LhsScalar,LhsMapper,ColMajor,ConjugateLhs,RhsScalar,RhsMapper,ConjugateRhs,Version>::run(
  Index rows, Index cols,
  const LhsMapper& alhs,
  const RhsMapper& rhs,
        ResScalar* res, Index resIncr,
  RhsScalar alpha)
{
  EIGEN_UNUSED_VARIABLE(resIncr);
  eigen_internal_assert(resIncr==1);

  // The following copy tells the compiler that lhs's attributes are not modified outside this function
  // This helps GCC to generate propoer code.
  LhsMapper lhs(alhs);

  conj_helper<LhsScalar,RhsScalar,ConjugateLhs,ConjugateRhs> cj;
  conj_helper<LhsPacket,RhsPacket,ConjugateLhs,ConjugateRhs> pcj;
  conj_helper<LhsPacketHalf,RhsPacketHalf,ConjugateLhs,ConjugateRhs> pcj_half;
  conj_helper<LhsPacketQuarter,RhsPacketQuarter,ConjugateLhs,ConjugateRhs> pcj_quarter;

  const Index lhsStride = lhs.stride();
  // TODO: for padded aligned inputs, we could enable aligned reads
  enum { LhsAlignment = Unaligned,
         ResPacketSize = Traits::ResPacketSize,
         ResPacketSizeHalf = HalfTraits::ResPacketSize,
         ResPacketSizeQuarter = QuarterTraits::ResPacketSize,
         LhsPacketSize = Traits::LhsPacketSize,
         HasHalf = (int)ResPacketSizeHalf < (int)ResPacketSize,
         HasQuarter = (int)ResPacketSizeQuarter < (int)ResPacketSizeHalf
  };

  const Index n8 = rows-8*ResPacketSize+1;
  const Index n4 = rows-4*ResPacketSize+1;
  const Index n3 = rows-3*ResPacketSize+1;
  const Index n2 = rows-2*ResPacketSize+1;
  const Index n1 = rows-1*ResPacketSize+1;
  const Index n_half = rows-1*ResPacketSizeHalf+1;
  const Index n_quarter = rows-1*ResPacketSizeQuarter+1;

  // TODO: improve the following heuristic:
  const Index block_cols = cols<128 ? cols : (lhsStride*sizeof(LhsScalar)<32000?16:4);
  ResPacket palpha = pset1<ResPacket>(alpha);
  ResPacketHalf palpha_half = pset1<ResPacketHalf>(alpha);
  ResPacketQuarter palpha_quarter = pset1<ResPacketQuarter>(alpha);

  for(Index j2=0; j2<cols; j2+=block_cols)
  {
    Index jend = numext::mini(j2+block_cols,cols);
    Index i=0;
    for(; i<n8; i+=ResPacketSize*8)
    {
      ResPacket c0 = pset1<ResPacket>(ResScalar(0)),
                c1 = pset1<ResPacket>(ResScalar(0)),
                c2 = pset1<ResPacket>(ResScalar(0)),
                c3 = pset1<ResPacket>(ResScalar(0)),
                c4 = pset1<ResPacket>(ResScalar(0)),
                c5 = pset1<ResPacket>(ResScalar(0)),
                c6 = pset1<ResPacket>(ResScalar(0)),
                c7 = pset1<ResPacket>(ResScalar(0));

      for(Index j=j2; j<jend; j+=1)
      {
        RhsPacket b0 = pset1<RhsPacket>(rhs(j,0));
        c0 = pcj.pmadd(lhs.template load<LhsPacket,LhsAlignment>(i+LhsPacketSize*0,j),b0,c0);
        c1 = pcj.pmadd(lhs.template load<LhsPacket,LhsAlignment>(i+LhsPacketSize*1,j),b0,c1);
        c2 = pcj.pmadd(lhs.template load<LhsPacket,LhsAlignment>(i+LhsPacketSize*2,j),b0,c2);
        c3 = pcj.pmadd(lhs.template load<LhsPacket,LhsAlignment>(i+LhsPacketSize*3,j),b0,c3);
        c4 = pcj.pmadd(lhs.template load<LhsPacket,LhsAlignment>(i+LhsPacketSize*4,j),b0,c4);
        c5 = pcj.pmadd(lhs.template load<LhsPacket,LhsAlignment>(i+LhsPacketSize*5,j),b0,c5);
        c6 = pcj.pmadd(lhs.template load<LhsPacket,LhsAlignment>(i+LhsPacketSize*6,j),b0,c6);
        c7 = pcj.pmadd(lhs.template load<LhsPacket,LhsAlignment>(i+LhsPacketSize*7,j),b0,c7);
      }
      pstoreu(res+i+ResPacketSize*0, pmadd(c0,palpha,ploadu<ResPacket>(res+i+ResPacketSize*0)));
      pstoreu(res+i+ResPacketSize*1, pmadd(c1,palpha,ploadu<ResPacket>(res+i+ResPacketSize*1)));
      pstoreu(res+i+ResPacketSize*2, pmadd(c2,palpha,ploadu<ResPacket>(res+i+ResPacketSize*2)));
      pstoreu(res+i+ResPacketSize*3, pmadd(c3,palpha,ploadu<ResPacket>(res+i+ResPacketSize*3)));
      pstoreu(res+i+ResPacketSize*4, pmadd(c4,palpha,ploadu<ResPacket>(res+i+ResPacketSize*4)));
      pstoreu(res+i+ResPacketSize*5, pmadd(c5,palpha,ploadu<ResPacket>(res+i+ResPacketSize*5)));
      pstoreu(res+i+ResPacketSize*6, pmadd(c6,palpha,ploadu<ResPacket>(res+i+ResPacketSize*6)));
      pstoreu(res+i+ResPacketSize*7, pmadd(c7,palpha,ploadu<ResPacket>(res+i+ResPacketSize*7)));
    }
    if(i<n4)
    {
      ResPacket c0 = pset1<ResPacket>(ResScalar(0)),
                c1 = pset1<ResPacket>(ResScalar(0)),
                c2 = pset1<ResPacket>(ResScalar(0)),
                c3 = pset1<ResPacket>(ResScalar(0));

      for(Index j=j2; j<jend; j+=1)
      {
        RhsPacket b0 = pset1<RhsPacket>(rhs(j,0));
        c0 = pcj.pmadd(lhs.template load<LhsPacket,LhsAlignment>(i+LhsPacketSize*0,j),b0,c0);
        c1 = pcj.pmadd(lhs.template load<LhsPacket,LhsAlignment>(i+LhsPacketSize*1,j),b0,c1);
        c2 = pcj.pmadd(lhs.template load<LhsPacket,LhsAlignment>(i+LhsPacketSize*2,j),b0,c2);
        c3 = pcj.pmadd(lhs.template load<LhsPacket,LhsAlignment>(i+LhsPacketSize*3,j),b0,c3);
      }
      pstoreu(res+i+ResPacketSize*0, pmadd(c0,palpha,ploadu<ResPacket>(res+i+ResPacketSize*0)));
      pstoreu(res+i+ResPacketSize*1, pmadd(c1,palpha,ploadu<ResPacket>(res+i+ResPacketSize*1)));
      pstoreu(res+i+ResPacketSize*2, pmadd(c2,palpha,ploadu<ResPacket>(res+i+ResPacketSize*2)));
      pstoreu(res+i+ResPacketSize*3, pmadd(c3,palpha,ploadu<ResPacket>(res+i+ResPacketSize*3)));

      i+=ResPacketSize*4;
    }
    if(i<n3)
    {
      ResPacket c0 = pset1<ResPacket>(ResScalar(0)),
                c1 = pset1<ResPacket>(ResScalar(0)),
                c2 = pset1<ResPacket>(ResScalar(0));

      for(Index j=j2; j<jend; j+=1)
      {
        RhsPacket b0 = pset1<RhsPacket>(rhs(j,0));
        c0 = pcj.pmadd(lhs.template load<LhsPacket,LhsAlignment>(i+LhsPacketSize*0,j),b0,c0);
        c1 = pcj.pmadd(lhs.template load<LhsPacket,LhsAlignment>(i+LhsPacketSize*1,j),b0,c1);
        c2 = pcj.pmadd(lhs.template load<LhsPacket,LhsAlignment>(i+LhsPacketSize*2,j),b0,c2);
      }
      pstoreu(res+i+ResPacketSize*0, pmadd(c0,palpha,ploadu<ResPacket>(res+i+ResPacketSize*0)));
      pstoreu(res+i+ResPacketSize*1, pmadd(c1,palpha,ploadu<ResPacket>(res+i+ResPacketSize*1)));
      pstoreu(res+i+ResPacketSize*2, pmadd(c2,palpha,ploadu<ResPacket>(res+i+ResPacketSize*2)));

      i+=ResPacketSize*3;
    }
    if(i<n2)
    {
      ResPacket c0 = pset1<ResPacket>(ResScalar(0)),
                c1 = pset1<ResPacket>(ResScalar(0));

      for(Index j=j2; j<jend; j+=1)
      {
        RhsPacket b0 = pset1<RhsPacket>(rhs(j,0));
        c0 = pcj.pmadd(lhs.template load<LhsPacket,LhsAlignment>(i+LhsPacketSize*0,j),b0,c0);
        c1 = pcj.pmadd(lhs.template load<LhsPacket,LhsAlignment>(i+LhsPacketSize*1,j),b0,c1);
      }
      pstoreu(res+i+ResPacketSize*0, pmadd(c0,palpha,ploadu<ResPacket>(res+i+ResPacketSize*0)));
      pstoreu(res+i+ResPacketSize*1, pmadd(c1,palpha,ploadu<ResPacket>(res+i+ResPacketSize*1)));
      i+=ResPacketSize*2;
    }
    if(i<n1)
    {
      ResPacket c0 = pset1<ResPacket>(ResScalar(0));
      for(Index j=j2; j<jend; j+=1)
      {
        RhsPacket b0 = pset1<RhsPacket>(rhs(j,0));
        c0 = pcj.pmadd(lhs.template load<LhsPacket,LhsAlignment>(i+0,j),b0,c0);
      }
      pstoreu(res+i+ResPacketSize*0, pmadd(c0,palpha,ploadu<ResPacket>(res+i+ResPacketSize*0)));
      i+=ResPacketSize;
    }
    if(HasHalf && i<n_half)
    {
      ResPacketHalf c0 = pset1<ResPacketHalf>(ResScalar(0));
      for(Index j=j2; j<jend; j+=1)
      {
        RhsPacketHalf b0 = pset1<RhsPacketHalf>(rhs(j,0));
        c0 = pcj_half.pmadd(lhs.template load<LhsPacketHalf,LhsAlignment>(i+0,j),b0,c0);
      }
      pstoreu(res+i+ResPacketSizeHalf*0, pmadd(c0,palpha_half,ploadu<ResPacketHalf>(res+i+ResPacketSizeHalf*0)));
      i+=ResPacketSizeHalf;
    }
    if(HasQuarter && i<n_quarter)
    {
      ResPacketQuarter c0 = pset1<ResPacketQuarter>(ResScalar(0));
      for(Index j=j2; j<jend; j+=1)
      {
        RhsPacketQuarter b0 = pset1<RhsPacketQuarter>(rhs(j,0));
        c0 = pcj_quarter.pmadd(lhs.template load<LhsPacketQuarter,LhsAlignment>(i+0,j),b0,c0);
      }
      pstoreu(res+i+ResPacketSizeQuarter*0, pmadd(c0,palpha_quarter,ploadu<ResPacketQuarter>(res+i+ResPacketSizeQuarter*0)));
      i+=ResPacketSizeQuarter;
    }
    for(;i<rows;++i)
    {
      ResScalar c0(0);
      for(Index j=j2; j<jend; j+=1)
        c0 += cj.pmul(lhs(i,j), rhs(j,0));
      res[i] += alpha*c0;
    }
  }
}